

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::SimpleDirectiveSyntax::setChild
          (SimpleDirectiveSyntax *this,size_t index,TokenOrSyntax child)

{
  logic_error *this_00;
  Token TVar1;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index == 0) {
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->super_DirectiveSyntax).directive.kind = TVar1.kind;
    (this->super_DirectiveSyntax).directive.field_0x2 = TVar1._2_1_;
    (this->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)TVar1.numFlags.raw;
    (this->super_DirectiveSyntax).directive.rawLen = TVar1.rawLen;
    (this->super_DirectiveSyntax).directive.info = TVar1.info;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0x2e19);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void SimpleDirectiveSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: directive = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}